

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O2

void calc_grid(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  dVar8 = dt;
  lVar1 = 0;
  uVar3 = 0;
  while (uVar3 != 0x32) {
    uVar3 = uVar3 + 1;
    uVar4 = uVar3 & 0xffffffff;
    if (uVar3 == 0x32) {
      uVar4 = 0;
    }
    for (lVar6 = 0; lVar6 != 400; lVar6 = lVar6 + 8) {
      *(double *)((long)ax[0] + lVar1 + lVar6) =
           *(double *)((long)p[0] + lVar1 + lVar6) - *(double *)((long)p[uVar4] + lVar6);
    }
    lVar1 = lVar1 + 400;
  }
  lVar1 = 0;
  uVar3 = 0;
  while (uVar3 != 0x32) {
    uVar3 = uVar3 + 1;
    uVar4 = uVar3 & 0xffffffff;
    if (uVar3 == 0x32) {
      uVar4 = 0;
    }
    for (lVar6 = 0; lVar6 != 20000; lVar6 = lVar6 + 400) {
      *(double *)((long)ay[0] + lVar1 + lVar6) =
           *(double *)((long)p[0] + lVar1 + lVar6) - *(double *)((long)p[0] + uVar4 * 8 + lVar6);
    }
    lVar1 = lVar1 + 8;
  }
  dVar8 = dVar8 * 10.0;
  lVar1 = 0;
  for (lVar6 = 0; lVar6 != 0x32; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar7 != 400; lVar7 = lVar7 + 8) {
      lVar2 = lVar1 + lVar7;
      *(double *)((long)vx[0] + lVar2) =
           *(double *)((long)ax[0] + lVar2) * dVar8 + *(double *)((long)vx[0] + lVar2);
      *(double *)((long)vy[0] + lVar2) =
           *(double *)((long)ay[0] + lVar2) * dVar8 + *(double *)((long)vy[0] + lVar2);
    }
    lVar1 = lVar1 + 400;
  }
  lVar1 = 0x1648a8;
  lVar7 = 0x1696c8;
  lVar2 = 0x16e4e8;
  for (lVar6 = 1; lVar6 != 0x32; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; lVar5 != 0x31; lVar5 = lVar5 + 1) {
      *(double *)(lVar1 + lVar5 * 8) =
           (((*(double *)(lVar7 + -400 + lVar5 * 8) - *(double *)(lVar7 + lVar5 * 8)) +
            *(double *)(lVar2 + -8 + lVar5 * 8)) - *(double *)(lVar2 + lVar5 * 8)) * dVar8 +
           *(double *)(lVar1 + lVar5 * 8);
    }
    lVar1 = lVar1 + 400;
    lVar7 = lVar7 + 400;
    lVar2 = lVar2 + 400;
  }
  return;
}

Assistant:

void calc_grid(void)
{
    int x, y, x2, y2;
    double time_step = dt * ANIMATION_SPEED;

    // Compute accelerations
    for (x = 0;  x < GRIDW;  x++)
    {
        x2 = (x + 1) % GRIDW;
        for(y = 0; y < GRIDH; y++)
            ax[x][y] = p[x][y] - p[x2][y];
    }

    for (y = 0;  y < GRIDH;  y++)
    {
        y2 = (y + 1) % GRIDH;
        for(x = 0; x < GRIDW; x++)
            ay[x][y] = p[x][y] - p[x][y2];
    }

    // Compute speeds
    for (x = 0;  x < GRIDW;  x++)
    {
        for (y = 0;  y < GRIDH;  y++)
        {
            vx[x][y] = vx[x][y] + ax[x][y] * time_step;
            vy[x][y] = vy[x][y] + ay[x][y] * time_step;
        }
    }

    // Compute pressure
    for (x = 1;  x < GRIDW;  x++)
    {
        x2 = x - 1;
        for (y = 1;  y < GRIDH;  y++)
        {
            y2 = y - 1;
            p[x][y] = p[x][y] + (vx[x2][y] - vx[x][y] + vy[x][y2] - vy[x][y]) * time_step;
        }
    }
}